

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2channel_window_override_removed(SshChannel *sc)

{
  int newwin;
  ssh2_connection_state *s;
  ssh2_channel *c;
  SshChannel *sc_local;
  
  if (*(int *)&(sc[-1].cl)->vt == 0) {
    newwin = 0x4000;
    if ((((ssh2_channel *)(sc + -0xb))->connlayer->ssh_is_simple & 1U) != 0) {
      newwin = 0x7fffffff;
    }
    ssh2_set_window((ssh2_channel *)(sc + -0xb),newwin);
    return;
  }
  __assert_fail("!c->chan->initial_fixed_window_size",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/ssh/connection2.c"
                ,0x5a7,"void ssh2channel_window_override_removed(SshChannel *)");
}

Assistant:

static void ssh2channel_window_override_removed(SshChannel *sc)
{
    struct ssh2_channel *c = container_of(sc, struct ssh2_channel, sc);
    struct ssh2_connection_state *s = c->connlayer;

    /*
     * This function is called when a client-side Channel has just
     * stopped requiring an initial fixed-size window.
     */
    assert(!c->chan->initial_fixed_window_size);
    ssh2_set_window(c, s->ssh_is_simple ? OUR_V2_BIGWIN : OUR_V2_WINSIZE);
}